

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f278::
ARTOOMTest_Node16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTOOMTest_Node16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  const_reference pvVar1;
  ARTOOMTest_Node16_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  pvVar1 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  (anonymous_namespace)::
  oom_insert_test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,(anonymous_namespace)::ARTOOMTest_Node16_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>&)_1_,(anonymous_namespace)::ARTOOMTest_Node16_Test<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::test::tree_verifier<unodb::db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>&)_2_>
            (3,5,pvVar1->_M_ptr,(pvVar1->_M_extent)._M_extent_value);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node16) {
  oom_insert_test<TypeParam>(
      3,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(0, 4);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({4, 1, 0, 0, 0});
        verifier.assert_growing_inodes({1, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      5, unodb::test::test_values[0],
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({5, 0, 1, 0, 0});
        verifier.assert_growing_inodes({1, 1, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}